

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

int64_t CLI::detail::to_flag_value(string *val)

{
  byte bVar1;
  int64_t iVar2;
  int64_t iVar3;
  __type_conflict _Var4;
  bool bVar5;
  int iVar6;
  int64_t iVar7;
  int *piVar8;
  char *loc_ptr;
  string local_40;
  
  if ((to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_),
     iVar6 != 0)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,"true",
               (allocator<char> *)&loc_ptr);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  }
  if ((to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_),
     iVar6 != 0)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,"false",
               (allocator<char> *)&loc_ptr);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  }
  _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  iVar2 = 1;
  iVar7 = iVar2;
  if (!_Var4) {
    _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
    iVar3 = -1;
    iVar7 = iVar3;
    if (!_Var4) {
      ::std::__cxx11::string::string
                ((string *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
      to_lower((string *)&loc_ptr,&local_40);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc_ptr);
      ::std::__cxx11::string::~string((string *)&loc_ptr);
      ::std::__cxx11::string::~string((string *)&local_40);
      if (val->_M_string_length == 1) {
        bVar1 = *(val->_M_dataplus)._M_p;
        if ((byte)(bVar1 - 0x31) < 9) {
          iVar7 = (ulong)bVar1 - 0x30;
        }
        else {
          iVar7 = iVar2;
          if ((((((ulong)bVar1 != 0x2b) && (iVar7 = iVar3, bVar1 != 0x2d)) && (bVar1 != 0x30)) &&
              ((bVar1 != 0x66 && (bVar1 != 0x6e)))) &&
             ((iVar7 = iVar2, bVar1 != 0x79 && (bVar1 != 0x74)))) {
            piVar8 = __errno_location();
            *piVar8 = 0x16;
            iVar7 = iVar3;
          }
        }
      }
      else {
        _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&to_flag_value(std::__cxx11::string)::
                                             trueString_abi_cxx11_);
        iVar7 = iVar2;
        if ((((!_Var4) &&
             (bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)val,"on"), !bVar5)) &&
            (bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)val,"yes"), !bVar5)) &&
           (((bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)val,"enable"), !bVar5 &&
             (_Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&to_flag_value(std::__cxx11::string)::
                                                   falseString_abi_cxx11_), iVar7 = iVar3, !_Var4))
            && ((bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)val,"off"), !bVar5 &&
                ((bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)val,"no"), !bVar5 &&
                 (bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)val,"disable"), !bVar5)))))))) {
          loc_ptr = (char *)0x0;
          iVar7 = strtoll((val->_M_dataplus)._M_p,&loc_ptr,0);
          if ((loc_ptr != (val->_M_dataplus)._M_p + val->_M_string_length) &&
             (piVar8 = __errno_location(), *piVar8 == 0)) {
            *piVar8 = 0x16;
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

inline std::int64_t to_flag_value(std::string val) noexcept {
    static const std::string trueString("true");
    static const std::string falseString("false");
    if(val == trueString) {
        return 1;
    }
    if(val == falseString) {
        return -1;
    }
    val = detail::to_lower(val);
    std::int64_t ret = 0;
    if(val.size() == 1) {
        if(val[0] >= '1' && val[0] <= '9') {
            return (static_cast<std::int64_t>(val[0]) - '0');
        }
        switch(val[0]) {
        case '0':
        case 'f':
        case 'n':
        case '-':
            ret = -1;
            break;
        case 't':
        case 'y':
        case '+':
            ret = 1;
            break;
        default:
            errno = EINVAL;
            return -1;
        }
        return ret;
    }
    if(val == trueString || val == "on" || val == "yes" || val == "enable") {
        ret = 1;
    } else if(val == falseString || val == "off" || val == "no" || val == "disable") {
        ret = -1;
    } else {
        char *loc_ptr{nullptr};
        ret = std::strtoll(val.c_str(), &loc_ptr, 0);
        if(loc_ptr != (val.c_str() + val.size()) && errno == 0) {
            errno = EINVAL;
        }
    }
    return ret;
}